

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_cvars.cpp
# Opt level: O0

void FBaseCVar::EnableCallbacks(void)

{
  FBaseCVar *local_10;
  FBaseCVar *cvar;
  
  m_UseCallback = true;
  for (local_10 = CVars; local_10 != (FBaseCVar *)0x0; local_10 = local_10->m_Next) {
    if ((local_10->Flags & 0x200) == 0) {
      Callback(local_10);
    }
  }
  return;
}

Assistant:

void FBaseCVar::EnableCallbacks ()
{
	m_UseCallback = true;
	FBaseCVar *cvar = CVars;

	while (cvar)
	{
		if (!(cvar->Flags & CVAR_NOINITCALL))
		{
			cvar->Callback ();
		}
		cvar = cvar->m_Next;
	}
}